

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O2

int gotobop(int f,int n)

{
  byte *pbVar1;
  line *plVar2;
  line *plVar3;
  uint uVar4;
  bool bVar5;
  buffer *pbVar6;
  mgwin *pmVar7;
  bool bVar8;
  int iVar9;
  ushort **ppuVar10;
  line *plVar11;
  ulong uVar12;
  
  pmVar7 = curwp;
  pbVar6 = curbp;
  if (n < 0) {
    iVar9 = gotoeop(f,-n);
    return iVar9;
  }
LAB_001135c9:
  do {
    if (n < 1) {
      pmVar7->w_rflag = pmVar7->w_rflag | 2;
      return 1;
    }
    n = n + -1;
    plVar2 = pbVar6->b_headp;
    bVar5 = false;
    plVar11 = pmVar7->w_dotp;
    while (plVar3 = plVar11->l_bp, plVar3 != plVar2) {
      pmVar7->w_doto = 0;
      uVar4 = plVar11->l_used;
      if (plVar11->l_used < 1) {
        uVar4 = 0;
      }
      uVar12 = 0;
      do {
        if (uVar4 == uVar12) {
          bVar8 = false;
          if (bVar5) goto LAB_001135c9;
          goto LAB_00113636;
        }
        ppuVar10 = __ctype_b_loc();
        pbVar1 = (byte *)(plVar11->l_text + uVar12);
        uVar12 = uVar12 + 1;
      } while ((*(byte *)((long)*ppuVar10 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
      bVar8 = true;
LAB_00113636:
      bVar5 = bVar8;
      pmVar7->w_dotline = pmVar7->w_dotline + -1;
      pmVar7->w_dotp = plVar3;
      plVar11 = plVar3;
    }
  } while( true );
}

Assistant:

int
gotobop(int f, int n)
{
	int col, nospace;

	/* the other way... */
	if (n < 0)
		return (gotoeop(f, -n));

	while (n-- > 0) {
		nospace = 0;
		while (lback(curwp->w_dotp) != curbp->b_headp) {
			curwp->w_doto = 0;
			col = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotline--;
			curwp->w_dotp = lback(curwp->w_dotp);
		}
	}
	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}